

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O2

void __thiscall
duckdb::CSVOption<duckdb::StrpTimeFormat>::CSVOption
          (CSVOption<duckdb::StrpTimeFormat> *this,CSVOption<duckdb::StrpTimeFormat> *param_1)

{
  this->set_by_user = param_1->set_by_user;
  StrpTimeFormat::StrpTimeFormat(&this->value,&param_1->value);
  return;
}

Assistant:

CSVOption(T value_p) : value(value_p) { // NOLINT: allow implicit conversion from value
	}